

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O3

TaggedStringPtr __thiscall
google::protobuf::internal::TaggedStringPtr::ForceCopy(TaggedStringPtr *this,Arena *arena)

{
  size_t sVar1;
  Arena *arena_00;
  size_t *psVar2;
  TaggedStringPtr TVar3;
  string *psVar4;
  undefined8 extraout_RAX;
  char *in_RCX;
  string_view s;
  
  psVar2 = (size_t *)((ulong)this->ptr_ & 0xfffffffffffffffc);
  sVar1 = *psVar2;
  arena_00 = (Arena *)psVar2[1];
  if (arena != (Arena *)0x0) {
    s._M_str = in_RCX;
    s._M_len = sVar1;
    TVar3 = anon_unknown_7::CreateArenaString((anon_unknown_7 *)arena,arena_00,s);
    return (TaggedStringPtr)TVar3.ptr_;
  }
  psVar4 = (string *)operator_new(0x20);
  *(string **)psVar4 = psVar4 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            (psVar4,sVar1,(long)&(arena_00->impl_).tag_and_id_ + sVar1);
  if (((ulong)psVar4 & 3) == 0) {
    return (TaggedStringPtr)(void *)((ulong)psVar4 | 2);
  }
  ForceCopy();
  operator_delete(psVar4,0x20);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

std::string* ArenaStringPtr::Release() {
  ScopedCheckPtrInvariants check(&tagged_ptr_);
  if (IsDefault()) return nullptr;

  std::string* released = tagged_ptr_.Get();
  if (tagged_ptr_.IsArena()) {
    released = tagged_ptr_.IsMutable() ? new std::string(std::move(*released))
                                       : new std::string(*released);
  }
  InitDefault();
  return released;
}